

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_d00101::MiniscriptDescriptor::MakeScripts
          (MiniscriptDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> scripts,FlatSigningProvider *provider)

{
  bool bVar1;
  XOnlyPubKey *in1;
  element_type *this_00;
  CScript *in_RDI;
  long in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_bool> pVar2;
  CPubKey *key;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range2;
  MiniscriptContext script_ctx;
  const_iterator __end2;
  const_iterator __begin2;
  MiniscriptContext in_stack_fffffffffffffea8;
  MiniscriptContext in_stack_fffffffffffffeac;
  CPubKey *in_stack_fffffffffffffeb0;
  CPubKey *in_stack_fffffffffffffeb8;
  uint160 *in_stack_fffffffffffffec0;
  ScriptMaker *ctx;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *in_stack_fffffffffffffec8;
  ScriptMaker local_a0;
  _Base_ptr local_90;
  undefined1 local_88;
  _Base_ptr local_80;
  undefined1 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  miniscript::Node<unsigned_int>::GetMsCtx
            ((Node<unsigned_int> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffeb0);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::end
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffeb0);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                      ((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                        *)in_stack_fffffffffffffeb8,
                       (__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                        *)in_stack_fffffffffffffeb0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator*((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *
              )CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    bVar1 = miniscript::IsTapscript(in_stack_fffffffffffffea8);
    if (bVar1) {
      in1 = (XOnlyPubKey *)(in_R9 + 0x38);
      XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      Hash160<XOnlyPubKey>(in1);
      pVar2 = std::
              map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
              ::emplace<uint160,CPubKey_const&>
                        (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
      local_80 = (_Base_ptr)pVar2.first._M_node;
      local_78 = pVar2.second;
    }
    else {
      CPubKey::GetID((CPubKey *)(in_R9 + 0x38));
      pVar2 = std::
              map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
              ::emplace<CKeyID,CPubKey_const&>
                        (in_stack_fffffffffffffec8,(CKeyID *)in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
      local_90 = (_Base_ptr)pVar2.first._M_node;
      local_88 = pVar2.second;
    }
    __gnu_cxx::__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
    operator++((__normal_iterator<const_CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
                *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  this_00 = std::
            __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  ctx = &local_a0;
  ScriptMaker::ScriptMaker
            ((ScriptMaker *)this_00,
             (vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac);
  miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>
            ((Node<unsigned_int> *)&stack0xffffffffffffff90,ctx);
  Vector<CScript>(in_RDI);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<CScript,_std::allocator<CScript>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts,
                                     FlatSigningProvider& provider) const override
    {
        const auto script_ctx{m_node->GetMsCtx()};
        for (const auto& key : keys) {
            if (miniscript::IsTapscript(script_ctx)) {
                provider.pubkeys.emplace(Hash160(XOnlyPubKey{key}), key);
            } else {
                provider.pubkeys.emplace(key.GetID(), key);
            }
        }
        return Vector(m_node->ToScript(ScriptMaker(keys, script_ctx)));
    }